

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O1

vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
* dispatch_locks(vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
                 *__return_storage_ptr__,Command *cmd,DatabaseSnapshot *snap)

{
  undefined8 *puVar1;
  long lVar2;
  anon_class_8_1_89919cc8 local_30;
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  local_28;
  
  lVar2 = (long)(char)(cmd->
                      super__Variant_base<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
                      ).
                      super__Move_assign_alias<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
                      .
                      super__Copy_assign_alias<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
                      .
                      super__Move_ctor_alias<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
                      .
                      super__Copy_ctor_alias<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
                      .
                      super__Variant_storage_alias<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
                      ._M_index;
  local_30.snap = snap;
  if (lVar2 != -1) {
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/Daemon.cpp:285:9)_&&,_const_std::variant<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>_&>
      ::_S_vtable._M_arr[lVar2]._M_data)(&local_28,&local_30,cmd);
    (__return_storage_ptr__->
    super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_28.
         super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_28.
         super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_28.
         super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_28.
    super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.
    super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28.
    super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
    ::~vector(&local_28);
    return __return_storage_ptr__;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar1 = &PTR__exception_00261370;
  puVar1[1] = "std::visit: variant is valueless";
  __cxa_throw(puVar1,&std::bad_variant_access::typeinfo,std::exception::~exception);
}

Assistant:

std::vector<DatabaseLock> dispatch_locks(const Command &cmd,
                                         const DatabaseSnapshot *snap) {
    return std::move(std::visit(
        [snap](const auto &cmd) { return acquire_locks(cmd, snap); }, cmd));
}